

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupNamespaceURI(DOMNodeImpl *this,XMLCh *specifiedPrefix)

{
  short sVar1;
  short sVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  DOMNodeImpl *currentNode;
  int iVar5;
  DOMNode *pDVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNodeImpl *pDVar7;
  long lVar8;
  DOMNodeImpl *pDVar9;
  undefined2 *puVar10;
  XMLCh *pXVar11;
  undefined2 *puVar12;
  short *psVar13;
  long lVar14;
  XMLCh *pXVar15;
  undefined4 extraout_var_03;
  short *psVar16;
  XMLCh *pXVar17;
  long lVar18;
  DOMNodeImpl *pDVar19;
  undefined4 extraout_var_02;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  pDVar19 = currentNode;
  iVar5 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar5) {
  case 1:
    iVar5 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    pXVar15 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
    if (pXVar11 != (XMLCh *)0x0) {
      if (specifiedPrefix == (XMLCh *)0x0 && pXVar15 == (XMLCh *)0x0) {
        return pXVar11;
      }
      if (pXVar15 != (XMLCh *)0x0) {
        if (pXVar15 == specifiedPrefix) {
          return pXVar11;
        }
        if (specifiedPrefix == (XMLCh *)0x0) {
          XVar3 = *pXVar15;
joined_r0x002729b7:
          if (XVar3 == L'\0') {
            return pXVar11;
          }
        }
        else {
          lVar8 = 0;
          do {
            psVar13 = (short *)((long)pXVar15 + lVar8);
            if (*psVar13 == 0) {
              XVar3 = *(XMLCh *)((long)specifiedPrefix + lVar8);
              goto joined_r0x002729b7;
            }
            psVar16 = (short *)((long)specifiedPrefix + lVar8);
            lVar8 = lVar8 + 2;
          } while (*psVar13 == *psVar16);
        }
      }
    }
    pDVar19 = currentNode;
    iVar5 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar5 != '\0') {
      pDVar19 = currentNode;
      iVar5 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar7 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar5);
      if ((pDVar7 != (DOMNodeImpl *)0x0) &&
         (pDVar19 = pDVar7, lVar8 = (*(code *)pDVar7->fContainingNode[5]._vptr_DOMNode)(),
         lVar8 != 0)) {
        lVar18 = 0;
        do {
          pDVar9 = (DOMNodeImpl *)(*(code *)pDVar7->fContainingNode[3]._vptr_DOMNode)(pDVar7,lVar18)
          ;
          puVar10 = (undefined2 *)(*(code *)pDVar9->fContainingNode[0x17]._vptr_DOMNode)(pDVar9);
          pXVar11 = (XMLCh *)(*(code *)pDVar9->fContainingNode[3]._vptr_DOMNode)(pDVar9);
          puVar12 = (undefined2 *)(*(code *)pDVar9->fContainingNode[0x16]._vptr_DOMNode)(pDVar9);
          pDVar19 = (DOMNodeImpl *)&XMLUni::fgXMLNSString;
          if (puVar12 != (undefined2 *)0x0) {
            if (puVar12 == &XMLUni::fgXMLNSURIName) {
LAB_00272a91:
              if (specifiedPrefix == (XMLCh *)0x0) {
                psVar13 = (short *)(*(code *)pDVar9->fContainingNode[2]._vptr_DOMNode)(pDVar9);
                if (psVar13 == &XMLUni::fgXMLNSString) {
                  return pXVar11;
                }
                psVar16 = &XMLUni::fgXMLNSString;
                if (psVar13 == (short *)0x0) {
LAB_00272ad7:
                  if (*psVar16 == 0) {
                    return pXVar11;
                  }
                }
                else {
                  psVar16 = &XMLUni::fgXMLNSString;
                  do {
                    sVar1 = *psVar13;
                    if (sVar1 == 0) goto LAB_00272ad7;
                    psVar13 = psVar13 + 1;
                    sVar2 = *psVar16;
                    psVar16 = psVar16 + 1;
                  } while (sVar1 == sVar2);
                }
              }
              pDVar19 = (DOMNodeImpl *)&XMLUni::fgXMLNSString;
              if (puVar10 != (undefined2 *)0x0) {
                if (puVar10 == &XMLUni::fgXMLNSString) {
LAB_00272b11:
                  pXVar15 = (XMLCh *)(*(code *)pDVar9->fContainingNode[0x18]._vptr_DOMNode)();
                  if (pXVar15 == specifiedPrefix) {
                    return pXVar11;
                  }
                  pXVar17 = specifiedPrefix;
                  pDVar19 = pDVar9;
                  if ((specifiedPrefix == (XMLCh *)0x0) || (pXVar15 == (XMLCh *)0x0)) {
                    if (pXVar15 == (XMLCh *)0x0) {
                      if (specifiedPrefix == (XMLCh *)0x0) {
                        return pXVar11;
                      }
                    }
                    else if ((specifiedPrefix == (XMLCh *)0x0) || (*pXVar15 != L'\0')) {
                      if (*pXVar15 == L'\0') {
                        return pXVar11;
                      }
                      goto LAB_00272b88;
                    }
LAB_00272b7e:
                    if (*pXVar17 == L'\0') {
                      return pXVar11;
                    }
                  }
                  else {
                    do {
                      XVar3 = *pXVar15;
                      if (XVar3 == L'\0') goto LAB_00272b7e;
                      pXVar15 = pXVar15 + 1;
                      XVar4 = *pXVar17;
                      pXVar17 = pXVar17 + 1;
                    } while (XVar3 == XVar4);
                  }
                }
                else {
                  lVar14 = 0;
                  do {
                    psVar13 = (short *)((long)puVar10 + lVar14);
                    if (*psVar13 == 0) {
                      if (*(short *)((long)&XMLUni::fgXMLNSString + lVar14) == 0) goto LAB_00272b11;
                      break;
                    }
                    psVar16 = (short *)((long)&XMLUni::fgXMLNSString + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar13 == *psVar16);
                }
              }
            }
            else {
              lVar14 = 0;
              do {
                psVar13 = (short *)((long)puVar12 + lVar14);
                if (*psVar13 == 0) {
                  if (*(short *)((long)&XMLUni::fgXMLNSURIName + lVar14) == 0) goto LAB_00272a91;
                  break;
                }
                psVar16 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar14);
                lVar14 = lVar14 + 2;
              } while (*psVar13 == *psVar16);
            }
          }
LAB_00272b88:
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar8);
      }
    }
    pDVar6 = getElementAncestor(pDVar19,(DOMNode *)currentNode);
    break;
  case 2:
    iVar5 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar5 != 1) {
      return (XMLCh *)0x0;
    }
    pDVar6 = this->fOwnerNode;
    goto LAB_00272bab;
  default:
    pDVar6 = getElementAncestor(pDVar19,this->fContainingNode);
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    goto LAB_00272901;
  case 9:
    iVar5 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar6 = (DOMNode *)CONCAT44(extraout_var,iVar5);
    goto LAB_00272bab;
  }
  if (pDVar6 == (DOMNode *)0x0) {
LAB_00272901:
    return (XMLCh *)0x0;
  }
LAB_00272bab:
  iVar5 = (*pDVar6->_vptr_DOMNode[0x25])(pDVar6,specifiedPrefix);
  return (XMLCh *)CONCAT44(extraout_var_03,iVar5);
}

Assistant:

const XMLCh* DOMNodeImpl::lookupNamespaceURI(const XMLCh* specifiedPrefix) const  {
    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE : {
        const XMLCh* ns = thisNode->getNamespaceURI();
        const XMLCh* prefix = thisNode->getPrefix();
        if (ns != 0) {
            // REVISIT: is it possible that prefix is empty string?
            if (specifiedPrefix == 0 && prefix == specifiedPrefix) {
                // looking for default namespace
                return ns;
            } else if (prefix != 0 && XMLString::equals(prefix, specifiedPrefix)) {
                // non default namespace
                return ns;
            }
        }
        if (thisNode->hasAttributes()) {
            DOMNamedNodeMap *nodeMap = thisNode->getAttributes();
            if(nodeMap != 0) {
                XMLSize_t length = nodeMap->getLength();
                for (XMLSize_t i = 0;i < length;i++) {
                    DOMNode *attr = nodeMap->item(i);
                    const XMLCh *attrPrefix = attr->getPrefix();
                    const XMLCh *value = attr->getNodeValue();
                    ns = attr->getNamespaceURI();

                    if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                        // at this point we are dealing with DOM Level 2 nodes only
                        if (specifiedPrefix == 0 &&
                            XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString)) {
                            // default namespace
                            return value;
                        } else if (attrPrefix != 0 &&
                                   XMLString::equals(attrPrefix, XMLUni::fgXMLNSString) &&
                                   XMLString::equals(attr->getLocalName(), specifiedPrefix)) {
                            // non default namespace
                            return value;
                        }
                    }
                }
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    case DOMNode::DOCUMENT_NODE : {
        return((DOMDocument*)thisNode)->getDocumentElement()->lookupNamespaceURI(specifiedPrefix);
    }
    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(getContainingNode());
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    }
}